

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers_iterator.hpp
# Opt level: O3

void __thiscall
asio::buffers_iterator<asio::const_buffers_1,_char>::advance
          (buffers_iterator<asio::const_buffers_1,_char> *this,ptrdiff_t n)

{
  buffer_sequence_iterator_type pcVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  buffer_sequence_iterator_type pcVar8;
  size_t sVar9;
  size_t sVar10;
  buffer_sequence_iterator_type pcVar11;
  
  if (n < 1) {
    if (n < 0) {
      uVar7 = -n;
      uVar4 = this->position_;
      if (uVar4 < uVar7) {
        __assert_fail("position_ >= abs_n && \"iterator out of bounds\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/thirdparty/asio/asio/include/asio/buffers_iterator.hpp"
                      ,0x1bd,
                      "void asio::buffers_iterator<asio::const_buffers_1>::advance(std::ptrdiff_t) [BufferSequence = asio::const_buffers_1, ByteType = char]"
                     );
      }
      uVar6 = this->current_buffer_position_;
      if (uVar6 < uVar7) {
        pcVar1 = this->begin_;
        pcVar8 = this->current_;
        do {
          uVar7 = uVar7 - uVar6;
          uVar4 = uVar4 - uVar6;
          this->position_ = uVar4;
          pcVar11 = pcVar8;
          if (pcVar8 == pcVar1) {
            if (uVar7 != 0) {
              __assert_fail("abs_n == 0 && \"iterator out of bounds\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/thirdparty/asio/asio/include/asio/buffers_iterator.hpp"
                            ,0x1cf,
                            "void asio::buffers_iterator<asio::const_buffers_1>::advance(std::ptrdiff_t) [BufferSequence = asio::const_buffers_1, ByteType = char]"
                           );
            }
            sVar10 = 0;
            goto LAB_0012534f;
          }
          do {
            if (pcVar11 == pcVar1) goto LAB_0012531c;
            uVar2 = pcVar11[-1].size_;
            pcVar11 = pcVar11 + -1;
          } while (uVar2 == 0);
          pvVar3 = pcVar11->data_;
          this->current_ = pcVar11;
          (this->current_buffer_).data_ = pvVar3;
          (this->current_buffer_).size_ = uVar2;
          this->current_buffer_position_ = uVar2;
          uVar6 = uVar2;
          pcVar8 = pcVar11;
LAB_0012531c:
        } while (uVar6 < uVar7);
      }
      this->position_ = uVar4 - uVar7;
      sVar10 = uVar6 - uVar7;
LAB_0012534f:
      this->current_buffer_position_ = sVar10;
    }
  }
  else {
    pcVar1 = this->end_;
    if (this->current_ == pcVar1) {
      __assert_fail("current_ != end_ && \"iterator out of bounds\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/thirdparty/asio/asio/include/asio/buffers_iterator.hpp"
                    ,0x19b,
                    "void asio::buffers_iterator<asio::const_buffers_1>::advance(std::ptrdiff_t) [BufferSequence = asio::const_buffers_1, ByteType = char]"
                   );
    }
    sVar10 = this->current_buffer_position_;
    sVar9 = (this->current_buffer_).size_ - sVar10;
    sVar5 = this->position_;
    if ((long)sVar9 <= n) {
      sVar10 = 0;
      pcVar8 = this->current_;
      do {
        pcVar11 = pcVar8 + 1;
        n = n - sVar9;
        sVar5 = sVar5 + sVar9;
        this->position_ = sVar5;
        this->current_ = pcVar11;
        if (pcVar11 == pcVar1) {
          if (n == 0) {
            (this->current_buffer_).data_ = (void *)0x0;
            (this->current_buffer_).size_ = 0;
            this->current_buffer_position_ = 0;
            return;
          }
          __assert_fail("n == 0 && \"iterator out of bounds\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/thirdparty/asio/asio/include/asio/buffers_iterator.hpp"
                        ,0x1b1,
                        "void asio::buffers_iterator<asio::const_buffers_1>::advance(std::ptrdiff_t) [BufferSequence = asio::const_buffers_1, ByteType = char]"
                       );
        }
        sVar9 = pcVar8[1].size_;
        (this->current_buffer_).data_ = pcVar11->data_;
        (this->current_buffer_).size_ = sVar9;
        this->current_buffer_position_ = 0;
        sVar9 = (this->current_buffer_).size_;
        pcVar8 = pcVar11;
      } while ((long)sVar9 <= n);
    }
    this->position_ = sVar5 + n;
    this->current_buffer_position_ = sVar10 + n;
  }
  return;
}

Assistant:

void advance(std::ptrdiff_t n)
  {
    if (n > 0)
    {
      ASIO_ASSERT(current_ != end_ && "iterator out of bounds");
      for (;;)
      {
        std::ptrdiff_t current_buffer_balance
          = current_buffer_.size() - current_buffer_position_;

        // Check if the advance can be satisfied by the current buffer.
        if (current_buffer_balance > n)
        {
          position_ += n;
          current_buffer_position_ += n;
          return;
        }

        // Update position.
        n -= current_buffer_balance;
        position_ += current_buffer_balance;

        // Move to next buffer. If it is empty then it will be skipped on the
        // next iteration of this loop.
        if (++current_ == end_)
        {
          ASIO_ASSERT(n == 0 && "iterator out of bounds");
          current_buffer_ = buffer_type();
          current_buffer_position_ = 0;
          return;
        }
        current_buffer_ = *current_;
        current_buffer_position_ = 0;
      }
    }
    else if (n < 0)
    {
      std::size_t abs_n = -n;
      ASIO_ASSERT(position_ >= abs_n && "iterator out of bounds");
      for (;;)
      {
        // Check if the advance can be satisfied by the current buffer.
        if (current_buffer_position_ >= abs_n)
        {
          position_ -= abs_n;
          current_buffer_position_ -= abs_n;
          return;
        }

        // Update position.
        abs_n -= current_buffer_position_;
        position_ -= current_buffer_position_;

        // Check if we've reached the beginning of the buffers.
        if (current_ == begin_)
        {
          ASIO_ASSERT(abs_n == 0 && "iterator out of bounds");
          current_buffer_position_ = 0;
          return;
        }

        // Find the previous non-empty buffer.
        buffer_sequence_iterator_type iter = current_;
        while (iter != begin_)
        {
          --iter;
          buffer_type buffer = *iter;
          std::size_t buffer_size = buffer.size();
          if (buffer_size > 0)
          {
            current_ = iter;
            current_buffer_ = buffer;
            current_buffer_position_ = buffer_size;
            break;
          }
        }
      }
    }
  }